

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O3

void duckdb::OpenBracket(vector<unsigned_long,_true> *brackets,
                        vector<unsigned_long,_true> *cursor_brackets,idx_t pos,idx_t i)

{
  unsigned_long *puVar1;
  iterator iVar2;
  unsigned_long local_20;
  
  puVar1 = (cursor_brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_20 = i;
  if (pos == i) {
    iVar2._M_current =
         (cursor_brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (puVar1 != iVar2._M_current) {
      (cursor_brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
      iVar2._M_current = puVar1;
    }
    if (iVar2._M_current ==
        (cursor_brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)cursor_brackets,iVar2,
                 &local_20);
      puVar1 = (cursor_brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      *iVar2._M_current = pos;
      (cursor_brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  iVar2._M_current =
       (cursor_brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((puVar1 == iVar2._M_current) && (pos + 1 == local_20 || local_20 + 1 == pos)) {
    if (puVar1 == (cursor_brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)cursor_brackets,iVar2,
                 &local_20);
    }
    else {
      *iVar2._M_current = local_20;
      (cursor_brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  iVar2._M_current =
       (brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)brackets,iVar2,&local_20);
  }
  else {
    *iVar2._M_current = local_20;
    (brackets->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

static void OpenBracket(vector<idx_t> &brackets, vector<idx_t> &cursor_brackets, idx_t pos, idx_t i) {
	// check if the cursor is at this position
	if (pos == i) {
		// cursor is exactly on this position - always highlight this bracket
		if (!cursor_brackets.empty()) {
			cursor_brackets.clear();
		}
		cursor_brackets.push_back(i);
	}
	if (cursor_brackets.empty() && ((i + 1) == pos || (pos + 1) == i)) {
		// cursor is either BEFORE or AFTER this bracket and we don't have any highlighted bracket yet
		// highlight this bracket
		cursor_brackets.push_back(i);
	}
	brackets.push_back(i);
}